

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_tree.cpp
# Opt level: O1

bool __thiscall la::trie_tree::search(trie_tree *this,string *key)

{
  trie_node *ptVar1;
  undefined1 uVar2;
  size_t sVar3;
  trie_node *ptVar4;
  ulong uVar5;
  bool bVar6;
  
  ptVar4 = this->_root_node;
  bVar6 = key->_M_string_length != 0;
  if (bVar6) {
    sVar3 = trie_node::convertIndex((key->_M_dataplus)._M_p);
    ptVar1 = (ptVar4->_children)._M_elems[sVar3];
    if (ptVar1 != (trie_node *)0x0) {
      uVar5 = 1;
      do {
        ptVar4 = ptVar1;
        bVar6 = uVar5 < key->_M_string_length;
        if (!bVar6) break;
        sVar3 = trie_node::convertIndex((key->_M_dataplus)._M_p + uVar5);
        ptVar1 = (ptVar4->_children)._M_elems[sVar3];
        uVar5 = uVar5 + 1;
      } while (ptVar1 != (trie_node *)0x0);
    }
  }
  uVar2 = 0;
  if ((!bVar6) && (uVar2 = 0, ptVar4 != (trie_node *)0x0)) {
    uVar2 = ptVar4->_is_end_word;
  }
  return (bool)uVar2;
}

Assistant:

bool trie_tree::search(const std::string &key)
    {
        auto cur_node{_root_node};
        for (decltype(key.size()) i{0}; i < key.size(); ++i)
        {
            const auto ci{trie_node::convertIndex(key[i])};
            if (cur_node->_children[ci] == nullptr)
                return false;
            cur_node = cur_node->_children[ci];
        }
        return (cur_node != nullptr && cur_node->_is_end_word);
    }